

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandXSat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  abctime aVar3;
  char *pcVar4;
  FILE *pFile;
  xSAT_Solver_t *pxStack_60;
  int status;
  xSAT_Solver_t *p;
  char *pFileName;
  uint local_48;
  int nLearnedPerce;
  int nLearnedDelta;
  int nLearnedStart;
  int nInsLimit;
  int nConfLimit;
  int fVerbose;
  int c;
  abctime clk;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nInsLimit = 0;
  nLearnedStart = 0;
  nLearnedDelta = 0;
  nLearnedPerce = 0;
  local_48 = 0;
  pFileName._4_4_ = 0;
  clk = (abctime)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
LAB_002908f4:
  do {
    nConfLimit = Extra_UtilGetopt(argv_local._4_4_,(char **)clk,"CILDEhv");
    if (nConfLimit == -1) {
      if (argv_local._4_4_ == globalUtilOptind + 1) {
        p = *(xSAT_Solver_t **)(clk + (long)globalUtilOptind * 8);
        __stream = fopen((char *)p,"rb");
        if (__stream == (FILE *)0x0) {
          printf("Cannot open file \"%s\" for writing.\n",p);
          return 0;
        }
        xSAT_SolverParseDimacs((FILE *)__stream,&stack0xffffffffffffffa0);
        _fVerbose = Abc_Clock();
        iVar2 = xSAT_SolverSolve(pxStack_60);
        fclose(__stream);
        xSAT_SolverPrintStats(pxStack_60);
        if (iVar2 == 0) {
          Abc_Print(1,"UNDECIDED      ");
        }
        else if (iVar2 == 1) {
          Abc_Print(1,"SATISFIABLE    ");
        }
        else {
          Abc_Print(1,"UNSATISFIABLE  ");
        }
        aVar3 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar3 - _fVerbose);
        xSAT_SolverDestroy(pxStack_60);
        return 0;
      }
      goto LAB_00290c62;
    }
    switch(nConfLimit) {
    case 0x43:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
        goto LAB_00290c62;
      }
      nLearnedStart = atoi(*(char **)(clk + (long)globalUtilOptind * 8));
      uVar1 = nLearnedStart;
      break;
    case 0x44:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
        goto LAB_00290c62;
      }
      local_48 = atoi(*(char **)(clk + (long)globalUtilOptind * 8));
      uVar1 = local_48;
      break;
    case 0x45:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-E\" should be followed by an integer.\n");
        goto LAB_00290c62;
      }
      pFileName._4_4_ = atoi(*(char **)(clk + (long)globalUtilOptind * 8));
      uVar1 = pFileName._4_4_;
      break;
    default:
      goto LAB_00290c62;
    case 0x49:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_00290c62;
      }
      nLearnedDelta = atoi(*(char **)(clk + (long)globalUtilOptind * 8));
      uVar1 = nLearnedDelta;
      break;
    case 0x4c:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_00290c62;
      }
      nLearnedPerce = atoi(*(char **)(clk + (long)globalUtilOptind * 8));
      uVar1 = nLearnedPerce;
      break;
    case 0x68:
      goto LAB_00290c62;
    case 0x76:
      nInsLimit = nInsLimit ^ 1;
      goto LAB_002908f4;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar1 < 0) {
LAB_00290c62:
      Abc_Print(-2,"usage: xsat [-CILDE num] [-hv]<file>.cnf\n");
      Abc_Print(-2,"\t         solves the combinational miter using SAT solver MiniSat-1.14\n");
      Abc_Print(-2,"\t         derives CNF from the current network and leaves it unchanged\n");
      Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",
                (ulong)(uint)nLearnedStart);
      Abc_Print(-2,"\t-I num : limit on the number of inspections [default = %d]\n",
                (ulong)(uint)nLearnedDelta);
      Abc_Print(-2,"\t-L num : starting value for learned clause removal [default = %d]\n",
                (ulong)(uint)nLearnedPerce);
      Abc_Print(-2,"\t-D num : delta value for learned clause removal [default = %d]\n",
                (ulong)local_48);
      Abc_Print(-2,"\t-E num : ratio percentage for learned clause removal [default = %d]\n",
                (ulong)pFileName._4_4_);
      pcVar4 = "no";
      if (nInsLimit != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandXSat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    abctime clk;
    int c;
    int fVerbose   = 0;
    int nConfLimit = 0;
    int nInsLimit  = 0;
    int nLearnedStart = 0;
    int nLearnedDelta = 0;
    int nLearnedPerce = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CILDEhv" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nInsLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInsLimit < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLearnedStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLearnedStart < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            nLearnedDelta = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLearnedDelta < 0 )
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-E\" should be followed by an integer.\n" );
                goto usage;
            }
            nLearnedPerce = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLearnedPerce < 0 )
                goto usage;
            break;
        case 'h':
            goto usage;
        case 'v':
            fVerbose ^= 1;
            break;

        default:
            goto usage;
        }
    }

    if ( argc == globalUtilOptind + 1 )
    {
        char * pFileName = argv[globalUtilOptind];
        xSAT_Solver_t * p;
        int status;

        FILE * pFile = fopen( pFileName, "rb" );
        if ( pFile == NULL )
        {
            printf( "Cannot open file \"%s\" for writing.\n", pFileName );
            return 0;
        }
        xSAT_SolverParseDimacs( pFile, &p );

        clk = Abc_Clock();
        status = xSAT_SolverSolve( p );
        fclose( pFile );

        xSAT_SolverPrintStats( p );
        if ( status == 0 )
            Abc_Print( 1, "UNDECIDED      " );
        else if ( status == 1 )
            Abc_Print( 1, "SATISFIABLE    " );
        else
            Abc_Print( 1, "UNSATISFIABLE  " );

        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

        xSAT_SolverDestroy( p );
        return 0;
    }

usage:
    Abc_Print( -2, "usage: xsat [-CILDE num] [-hv]<file>.cnf\n" );
    Abc_Print( -2, "\t         solves the combinational miter using SAT solver MiniSat-1.14\n" );
    Abc_Print( -2, "\t         derives CNF from the current network and leaves it unchanged\n" );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n",    nConfLimit );
    Abc_Print( -2, "\t-I num : limit on the number of inspections [default = %d]\n", nInsLimit );
    Abc_Print( -2, "\t-L num : starting value for learned clause removal [default = %d]\n", nLearnedStart );
    Abc_Print( -2, "\t-D num : delta value for learned clause removal [default = %d]\n", nLearnedDelta );
    Abc_Print( -2, "\t-E num : ratio percentage for learned clause removal [default = %d]\n", nLearnedPerce );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}